

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

aiNode * __thiscall
anon_unknown.dwarf_d9e81e::ProcessSpatialStructure
          (anon_unknown_dwarf_d9e81e *this,aiNode *parent,IfcProduct *el,ConversionData *conv,
          vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
          *collect_openings)

{
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_00;
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  IfcProject *__n;
  _Base_ptr p_Var18;
  undefined8 *puVar19;
  pointer pLVar20;
  _Base_ptr p_Var21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  _Base_ptr p_Var33;
  undefined8 uVar34;
  _Base_ptr p_Var35;
  _Base_ptr p_Var36;
  _Base_ptr p_Var37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined4 uVar44;
  iterator iVar45;
  undefined1 auVar46 [8];
  pointer ppIVar47;
  pointer ppIVar48;
  bool bVar49;
  bool bVar50;
  pointer __p;
  long lVar51;
  aiNode *this_01;
  _Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_> *p_Var52;
  long *plVar53;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var54;
  aiString *paVar55;
  aiMetadataEntry *__s;
  undefined4 *puVar56;
  _Rb_tree_node_base *p_Var57;
  IfcObjectPlacement *place;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var58;
  IfcSpatialStructureElement *pIVar59;
  IfcElement *pIVar60;
  aiMatrix4x4t<float> *this_02;
  undefined1 *puVar61;
  LazyObject *pLVar62;
  Object *pOVar63;
  IfcObjectDefinition *pIVar64;
  __uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true> _Var65;
  aiNode **ppaVar66;
  IfcProductRepresentation *pIVar67;
  aiNode *paVar68;
  IFC *pIVar69;
  aiNode *paVar70;
  IfcCartesianTransformationOperator *op_00;
  IfcRepresentationMap *pIVar71;
  IfcRepresentation *pIVar72;
  reference ppaVar73;
  aiNode **__s_00;
  __uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_> _Var74;
  undefined1 *puVar75;
  long *plVar76;
  size_type *psVar77;
  _Base_ptr p_Var78;
  uint uVar79;
  iterator __begin3;
  aiString *paVar80;
  undefined8 *puVar81;
  TempOpening *op;
  size_t __n_00;
  TempOpening *pTVar82;
  IfcMatrix4 *pIVar83;
  const_iterator __position;
  aiMatrix4x4t<double> *paVar84;
  _Base_ptr p_Var85;
  const_iterator it;
  TempOpening *open;
  TempOpening *pTVar86;
  long lVar87;
  pointer pLVar88;
  ulong __n_01;
  ulong uVar89;
  bool bVar90;
  byte bVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  double dVar103;
  double dVar104;
  float fVar105;
  float fVar106;
  double dVar107;
  float fVar108;
  float fVar109;
  double dVar110;
  float fVar111;
  float fVar112;
  double dVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  float fVar121;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar122;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd;
  vector<aiNode_*,_std::allocator<aiNode_*>_> subnodes;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings_local;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_aggr;
  Metadata properties;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  repr_ordered;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  aiNode *ndnew;
  aiMetadata *local_7d0;
  double local_7a8;
  double local_768;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_758;
  allocator<char> local_749;
  _Base_ptr local_748;
  element_type *local_740;
  _Base_ptr local_738;
  _Base_ptr local_730;
  IfcProject *local_728;
  element_type *local_720;
  element_type *local_718;
  element_type *local_710;
  aiScene *local_708;
  IfcProject *local_700;
  aiNode *local_6f8;
  _Head_base<0UL,_aiNode_*,_false> local_6f0;
  aiNode **local_6e8;
  iterator iStack_6e0;
  aiNode **local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  aiNode *local_6b0;
  undefined1 local_6a8 [16];
  TempOpening TStack_698;
  _Base_ptr local_640;
  double dStack_638;
  _Base_ptr local_630;
  undefined1 local_628 [8];
  undefined1 local_620 [8];
  _Base_ptr local_618;
  _Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_> _Stack_610;
  aiNode *local_608;
  double local_600;
  undefined1 local_5f8 [16];
  _Base_ptr p_Stack_5e8;
  _Rb_tree_node_base *p_Stack_5e0;
  _Rb_tree_node_base *p_Stack_5d8;
  _Base_ptr local_5d0;
  _Base_ptr local_5c8;
  _Base_ptr p_Stack_5c0;
  _Base_ptr local_5b8;
  _Base_ptr p_Stack_5b0;
  _Base_ptr local_5a8;
  double local_5a0;
  pointer paStack_598;
  double local_590;
  _Base_ptr p_Stack_588;
  _Base_ptr local_580;
  aiNode *local_578;
  aiNode *local_570;
  _Rb_tree_node_base *local_568;
  pointer local_560;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  local_558;
  _Base_ptr local_540;
  _Base_ptr local_538;
  _Base_ptr local_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> local_508;
  long *local_4e8 [2];
  long local_4d8 [2];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_4c8;
  double local_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  IfcProject *local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  IfcProject *local_458;
  aiScene *paStack_450;
  element_type *local_448;
  element_type *peStack_440;
  undefined1 local_438 [112];
  double dStack_3c8;
  double local_3c0;
  
  bVar91 = 0;
  lVar87 = *(long *)&(el->super_IfcObject).field_0x18;
  local_578 = (aiNode *)conv;
  if ((**(char **)&el[1].super_IfcObject.field_0x28 == '\x01') &&
     (lVar51 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcSpace::typeinfo,0xffffffffffffffff),
     lVar51 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4e3f02);
    bVar50 = true;
  }
  else {
    bVar50 = false;
  }
  if ((*(char *)(*(long *)&el[1].super_IfcObject.field_0x28 + 2) == '\x01') &&
     (lVar51 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcAnnotation::typeinfo,0xffffffffffffffff),
     lVar51 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4e3f5f);
    this_01 = (aiNode *)0x0;
  }
  else {
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,
               *(char **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 0xc),
               (allocator<char> *)&local_6d0);
    p_Var52 = (_Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_> *)
              std::__cxx11::string::append((char *)&local_4c8);
    local_628 = (undefined1  [8])((long)local_620 + 8);
    _Var74._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
         (tuple<aiNode_*,_std::default_delete<aiNode>_>)(p_Var52 + 2);
    if ((tuple<aiNode_*,_std::default_delete<aiNode>_>)
        p_Var52->super__Head_base<0UL,_aiNode_*,_false> ==
        (_Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>)
        _Var74._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
        super__Head_base<0UL,_aiNode_*,_false>._M_head_impl) {
      local_618 = *(_Base_ptr *)
                   _Var74._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
      _Stack_610.super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
           p_Var52[3].super__Head_base<0UL,_aiNode_*,_false>;
    }
    else {
      local_618 = *(_Base_ptr *)
                   _Var74._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
      local_628 = (undefined1  [8])p_Var52->super__Head_base<0UL,_aiNode_*,_false>;
    }
    local_620 = *(undefined1 (*) [8])&p_Var52[1].super__Head_base<0UL,_aiNode_*,_false>;
    p_Var52->super__Head_base<0UL,_aiNode_*,_false> =
         (_Head_base<0UL,_aiNode_*,_false>)
         _Var74._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
         super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
    p_Var52[1].super__Head_base<0UL,_aiNode_*,_false> = (aiNode *)0x0;
    *(undefined1 *)&p_Var52[2].super__Head_base<0UL,_aiNode_*,_false> = 0;
    if ((parent->mName).data[0x54] == '\x01') {
      local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
      lVar51 = *(long *)((parent->mName).data + 0x34);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6d0,lVar51,*(long *)((parent->mName).data + 0x3c) + lVar51);
    }
    else {
      local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"Unnamed","");
    }
    plVar53 = (long *)std::__cxx11::string::_M_append(local_628,(ulong)local_6d0._M_dataplus._M_p);
    pTVar86 = (TempOpening *)(plVar53 + 2);
    if ((TempOpening *)*plVar53 == pTVar86) {
      TStack_698.solid = pTVar86->solid;
      TStack_698.extrusionDir.x = (double)plVar53[3];
      local_6a8._0_8_ = &TStack_698;
    }
    else {
      TStack_698.solid = pTVar86->solid;
      local_6a8._0_8_ = (TempOpening *)*plVar53;
    }
    local_6a8._8_8_ = plVar53[1];
    *plVar53 = (long)pTVar86;
    plVar53[1] = 0;
    *(undefined1 *)(plVar53 + 2) = 0;
    plVar53 = (long *)std::__cxx11::string::append(local_6a8);
    local_5f8._0_8_ = &p_Stack_5e8;
    paVar70 = (aiNode *)(plVar53 + 2);
    if ((aiNode *)*plVar53 == paVar70) {
      p_Stack_5e8 = *(_Base_ptr *)&paVar70->mName;
      p_Stack_5e0 = (_Rb_tree_node_base *)plVar53[3];
    }
    else {
      p_Stack_5e8 = *(_Base_ptr *)&paVar70->mName;
      local_5f8._0_8_ = (aiNode *)*plVar53;
    }
    local_5f8._8_8_ = plVar53[1];
    *plVar53 = (long)paVar70;
    plVar53[1] = 0;
    *(undefined1 *)(plVar53 + 2) = 0;
    plVar53 = (long *)std::__cxx11::string::_M_append
                                (local_5f8,*(ulong *)((parent->mName).data + 0xc));
    paVar70 = (aiNode *)(plVar53 + 2);
    if ((aiNode *)*plVar53 == paVar70) {
      local_438._16_8_ = *(undefined8 *)&paVar70->mName;
      local_438._24_8_ = plVar53[3];
      local_438._0_8_ = (aiNode *)(local_438 + 0x10);
    }
    else {
      local_438._16_8_ = *(undefined8 *)&paVar70->mName;
      local_438._0_8_ = (aiNode *)*plVar53;
    }
    __n = (IfcProject *)plVar53[1];
    *plVar53 = (long)paVar70;
    plVar53[1] = 0;
    *(undefined1 *)(plVar53 + 2) = 0;
    local_438._8_8_ = __n;
    if (__n < (IfcProject *)0x400) {
      (this_01->mName).length = (ai_uint32)__n;
      memcpy((this_01->mName).data,(void *)local_438._0_8_,(size_t)__n);
      (this_01->mName).data[(long)__n] = '\0';
    }
    if ((aiNode *)local_438._0_8_ != (aiNode *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,(ulong)((long)(uint *)local_438._16_8_ + 1));
    }
    if ((aiNode *)local_5f8._0_8_ != (aiNode *)&p_Stack_5e8) {
      operator_delete((void *)local_5f8._0_8_,(ulong)((long)&p_Stack_5e8->_M_color + 1));
    }
    if ((TempOpening *)local_6a8._0_8_ != &TStack_698) {
      operator_delete((void *)local_6a8._0_8_,
                      (ulong)((long)&((TStack_698.solid)->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     ._vptr_ObjectHelper + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
      operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
    }
    if (local_628 != (undefined1  [8])(local_620 + 8)) {
      operator_delete((void *)local_628,(ulong)((long)&local_618->_M_color + 1));
    }
    this_00 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)(lVar87 + 0xc0);
    if ((_Base_ptr *)local_4c8._M_impl._0_8_ !=
        &local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_4c8._M_impl._0_8_,
                      (ulong)((long)&(local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    this_01->mParent = (aiNode *)this;
    local_530 = (_Base_ptr)&el[1].super_IfcObject.field_0x40;
    local_438._0_8_ =
         *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_insert_unique<unsigned_long>
              ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *)local_530,(unsigned_long *)local_438);
    local_438._0_8_ =
         *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    pVar122 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::equal_range(this_00,(key_type_conflict *)local_438);
    _Var54 = pVar122.first._M_node;
    if (_Var54._M_node != (_Rb_tree_node_base *)(lVar87 + 200)) {
      p_Stack_5e0 = (_Rb_tree_node_base *)(local_5f8 + 8);
      local_5f8._8_8_ = local_5f8._8_8_ & 0xffffffff00000000;
      p_Stack_5e8 = (_Base_ptr)0x0;
      local_5d0 = (_Base_ptr)0x0;
      p_Stack_5d8 = p_Stack_5e0;
      if (_Var54._M_node == pVar122.second._M_node._M_node) {
        ProcessMetadata((uint64_t)_Var54._M_node[1]._M_parent,(ConversionData *)el,
                        (Metadata *)local_5f8);
      }
      else {
        do {
          ProcessMetadata((uint64_t)_Var54._M_node[1]._M_parent,(ConversionData *)el,
                          (Metadata *)local_5f8);
          _Var54._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var54._M_node);
        } while (_Var54._M_node != pVar122.second._M_node._M_node);
      }
      p_Var18 = local_5d0;
      if (local_5d0 != (_Base_ptr)0x0) {
        uVar79 = (uint)local_5d0;
        if (uVar79 == 0) {
          local_7d0 = (aiMetadata *)0x0;
        }
        else {
          local_7d0 = (aiMetadata *)operator_new(0x18);
          local_7d0->mKeys = (aiString *)0x0;
          local_7d0->mValues = (aiMetadataEntry *)0x0;
          local_7d0->mNumProperties = uVar79;
          paVar55 = (aiString *)operator_new__(((ulong)p_Var18 & 0xffffffff) * 0x404);
          paVar80 = paVar55;
          do {
            paVar80->length = 0;
            paVar80->data[0] = '\0';
            memset(paVar80->data + 1,0x1b,0x3ff);
            paVar80 = paVar80 + 1;
          } while (paVar80 != paVar55 + ((ulong)p_Var18 & 0xffffffff));
          local_7d0->mKeys = paVar55;
          uVar89 = (ulong)local_7d0->mNumProperties << 4;
          __s = (aiMetadataEntry *)operator_new__(uVar89);
          memset(__s,0,uVar89);
          local_7d0->mValues = __s;
        }
        if (p_Stack_5e0 != (_Rb_tree_node_base *)(local_5f8 + 8)) {
          uVar79 = 0;
          p_Var57 = p_Stack_5e0;
          do {
            __n_00 = (ulong)p_Var57[2]._M_parent & 0xffffffff;
            if (((ulong)p_Var57[2]._M_parent & 0xfffffc00) != 0) {
              __n_00 = 0x3ff;
            }
            local_438._0_4_ = (uint)__n_00;
            memcpy(local_438 + 4,*(void **)(p_Var57 + 2),__n_00);
            local_438[__n_00 + 4] = 0;
            if ((uVar79 < local_7d0->mNumProperties) &&
               (p_Var18 = p_Var57[1]._M_parent, p_Var18 != (_Base_ptr)0x0)) {
              if (p_Var18 < (_Base_ptr)0x400) {
                paVar55 = local_7d0->mKeys;
                paVar80 = paVar55 + uVar79;
                paVar80->length = (ai_uint32)p_Var18;
                memcpy(paVar80->data,*(void **)(p_Var57 + 1),(size_t)p_Var18);
                (&p_Var18->field_0x4)[(long)(paVar55 + uVar79)] = 0;
              }
              local_7d0->mValues[uVar79].mType = AI_AISTRING;
              puVar56 = (undefined4 *)operator_new(0x404);
              if (0x3fe < (uint)__n_00) {
                __n_00 = 0x3ff;
              }
              *puVar56 = (int)__n_00;
              memcpy(puVar56 + 1,local_438 + 4,__n_00);
              *(undefined1 *)((long)puVar56 + __n_00 + 4) = 0;
              local_7d0->mValues[uVar79].mData = puVar56;
            }
            uVar79 = uVar79 + 1;
            p_Var57 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var57);
          } while (p_Var57 != (_Rb_tree_node_base *)(local_5f8 + 8));
        }
        this_01->mMetaData = local_7d0;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_5f8);
    }
    if ((parent->mName).data[0xe4] == '\x01') {
      place = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                        (*(LazyObject **)((parent->mName).data + 0xdc));
      ResolveObjectPlacement(&this_01->mTransformation,place,(ConversionData *)el);
    }
    local_508.
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_508.
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_458 = (IfcProject *)0x0;
    paStack_450 = (aiScene *)0x0;
    local_448 = (element_type *)0x0;
    peStack_440 = (element_type *)0x0;
    local_478 = (IfcProject *)0x0;
    dStack_470 = 0.0;
    local_468 = 0.0;
    dStack_460 = 0.0;
    local_498 = 0.0;
    dStack_490 = 0.0;
    local_488 = 0.0;
    dStack_480 = 0.0;
    local_6d8 = (aiNode **)0x0;
    local_6e8 = (aiNode **)0x0;
    iStack_6e0._M_current = (aiNode **)0x0;
    local_438._0_8_ =
         *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    pVar122 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::equal_range(this_00,(key_type_conflict *)local_438);
    local_758 = pVar122.second._M_node;
    _Var54 = pVar122.first._M_node;
    if (_Var54._M_node != local_758._M_node) {
      puVar1 = &el[1].super_IfcObject.field_0x48;
      local_538 = (_Base_ptr)&this_01->mTransformation;
      local_540 = (_Base_ptr)0x0;
      local_768 = 1.0;
      local_740 = (element_type *)0x3ff0000000000000;
      local_7a8 = 1.0;
      local_6b0 = (aiNode *)0x3ff0000000000000;
      do {
        local_758 = pVar122.second._M_node;
        _Var58 = pVar122.first._M_node;
        puVar75 = *(undefined1 **)&el[1].super_IfcObject.field_0x50;
        puVar61 = puVar1;
        if (puVar75 != (undefined1 *)0x0) {
          do {
            bVar90 = *(_Base_ptr *)(puVar75 + 0x20) < _Var58._M_node[1]._M_parent;
            if (!bVar90) {
              puVar61 = puVar75;
            }
            puVar75 = *(undefined1 **)(puVar75 + (ulong)bVar90 * 8 + 0x10);
          } while (puVar75 != (undefined1 *)0x0);
        }
        puVar75 = puVar1;
        if ((puVar61 != puVar1) &&
           (puVar75 = puVar61, _Var58._M_node[1]._M_parent < *(_Base_ptr *)(puVar61 + 0x20))) {
          puVar75 = puVar1;
        }
        if (puVar75 == puVar1) {
          pLVar62 = Assimp::STEP::DB::MustGetObject
                              (*(DB **)&(el->super_IfcObject).field_0x18,
                               (uint64_t)_Var58._M_node[1]._M_parent);
          pOVar63 = Assimp::STEP::LazyObject::operator*(pLVar62);
          lVar87 = __dynamic_cast(pOVar63,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::
                                   typeinfo,0xffffffffffffffff);
          if (lVar87 == 0) {
            pOVar63 = Assimp::STEP::LazyObject::operator*(pLVar62);
            lVar87 = __dynamic_cast(pOVar63,&Assimp::STEP::Object::typeinfo,
                                    &Assimp::IFC::Schema_2x3::IfcRelVoidsElement::typeinfo,
                                    0xffffffffffffffff);
            if ((lVar87 != 0) &&
               (pIVar60 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcElement>
                                    (*(LazyObject **)(lVar87 + 0xb8)),
               *(long *)(&(pIVar60->super_IfcProduct).super_IfcObject.field_0x8 +
                        *(long *)(*(long *)&(pIVar60->super_IfcProduct).super_IfcObject + -0x18)) ==
               *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
              paVar70 = (aiNode *)
                        Assimp::STEP::LazyObject::
                        To<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction>
                                  (*(LazyObject **)(lVar87 + 0xc0));
              _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
              super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)operator_new(0x478);
              aiNode::aiNode((aiNode *)
                             _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t
                             .super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                             super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
              *(undefined4 *)
               _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
               super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
               super__Head_base<0UL,_aiNode_*,_false>._M_head_impl = 0x10;
              builtin_strncpy((char *)((long)_Var65.
                                             super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                             .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                      4),"$RelVoid",8);
              builtin_strncpy((char *)((long)_Var65.
                                             super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                             .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                      0xc),"sElement",8);
              *(char *)((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                              _M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x14) = '\0';
              *(aiNode **)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x448) = this_01;
              uVar44 = *(undefined4 *)&local_538->field_0x4;
              p_Var18 = local_538->_M_parent;
              p_Var21 = local_538->_M_left;
              p_Var33 = local_538->_M_right;
              uVar34 = *(undefined8 *)(local_538 + 1);
              p_Var35 = local_538[1]._M_parent;
              p_Var36 = local_538[1]._M_left;
              p_Var37 = local_538[1]._M_right;
              ((aiMatrix4x4 *)
              ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a1 =
                   (float)local_538->_M_color;
              ((aiMatrix4x4 *)
              ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a2 =
                   (float)uVar44;
              *(_Base_ptr *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = p_Var18;
              *(_Base_ptr *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) = p_Var21;
              *(_Base_ptr *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = p_Var33;
              *(undefined8 *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = uVar34;
              *(_Base_ptr *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = p_Var35;
              *(_Base_ptr *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = p_Var36;
              *(_Base_ptr *)
               ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = p_Var37;
              local_6a8._0_8_ = (TempOpening *)0x0;
              local_6a8._8_8_ = (TempOpening *)0x0;
              TStack_698.solid = (IfcSolidModel *)0x0;
              local_628 = (undefined1  [8])
                          _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
              paVar70 = ProcessSpatialStructure
                                  ((anon_unknown_dwarf_d9e81e *)
                                   _Var65.
                                   super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,paVar70,el,
                                   (ConversionData *)local_6a8,collect_openings);
              auVar46 = local_628;
              if (paVar70 != (aiNode *)0x0) {
                *(uint *)((long)local_628 + 0x450) = 1;
                ppaVar66 = (aiNode **)operator_new__(8);
                *ppaVar66 = (aiNode *)0x0;
                *(aiNode ***)((long)auVar46 + 0x458) = ppaVar66;
                *ppaVar66 = paVar70;
                if (local_6a8._8_8_ != local_6a8._0_8_) {
                  pTVar82 = (TempOpening *)local_6a8._0_8_;
                  pTVar86 = (TempOpening *)local_6a8._8_8_;
                  if (((ulong)local_540 & 1) == 0) {
                    local_5f8._0_8_ = *(undefined8 *)local_538;
                    local_5f8._8_8_ = local_538->_M_parent;
                    p_Stack_5e8 = local_538->_M_left;
                    p_Stack_5e0 = local_538->_M_right;
                    p_Stack_5d8 = *(_Rb_tree_node_base **)(local_538 + 1);
                    local_5d0 = local_538[1]._M_parent;
                    local_5c8 = local_538[1]._M_left;
                    p_Stack_5c0 = local_538[1]._M_right;
                    this_02 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_5f8);
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(this_02);
                    local_6b0 = (aiNode *)local_438._0_8_;
                    local_740 = (element_type *)local_438._40_8_;
                    local_448 = (element_type *)local_438._24_8_;
                    peStack_440 = (element_type *)local_438._32_8_;
                    local_458 = (IfcProject *)local_438._8_8_;
                    paStack_450 = (aiScene *)local_438._16_8_;
                    local_478 = (IfcProject *)local_438._48_8_;
                    dStack_470 = (double)local_438._56_8_;
                    local_468 = (double)local_438._64_8_;
                    dStack_460 = (double)local_438._72_8_;
                    local_768 = (double)local_438._80_8_;
                    local_498 = (double)local_438._88_8_;
                    dStack_490 = (double)local_438._96_8_;
                    local_488 = (double)local_438._104_8_;
                    dStack_480 = dStack_3c8;
                    local_7a8 = local_3c0;
                    local_540 = (_Base_ptr)CONCAT71((int7)((ulong)(local_438 + 8) >> 8),1);
                    pTVar82 = (TempOpening *)local_6a8._0_8_;
                    pTVar86 = (TempOpening *)local_6a8._8_8_;
                  }
                  for (; pTVar82 != pTVar86; pTVar82 = pTVar82 + 1) {
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
                              (&(**(aiNode ***)((long)local_628 + 0x458))->mTransformation);
                    local_6f8 = (aiNode *)
                                ((double)paStack_598 * (double)local_448 +
                                (double)local_5b8 * (double)paStack_450 +
                                (double)local_5f8._0_8_ * (double)local_6b0 +
                                (double)p_Stack_5d8 * (double)local_458);
                    local_700 = (IfcProject *)
                                (local_590 * (double)local_448 +
                                (double)p_Stack_5b0 * (double)paStack_450 +
                                (double)local_5f8._8_8_ * (double)local_6b0 +
                                (double)local_458 * (double)local_5d0);
                    local_730 = p_Stack_5e8;
                    local_708 = (aiScene *)
                                ((double)p_Stack_588 * (double)local_448 +
                                (double)local_5a8 * (double)paStack_450 +
                                (double)p_Stack_5e8 * (double)local_6b0 +
                                (double)local_458 * (double)local_5c8);
                    local_748 = p_Stack_5c0;
                    local_710 = (element_type *)
                                ((double)local_448 * (double)local_580 +
                                (double)paStack_450 * local_5a0 +
                                (double)p_Stack_5e0 * (double)local_6b0 +
                                (double)local_458 * (double)p_Stack_5c0);
                    local_568 = p_Stack_5d8;
                    local_570 = (aiNode *)local_5f8._0_8_;
                    local_738 = local_5b8;
                    local_560 = paStack_598;
                    local_718 = (element_type *)
                                ((double)paStack_598 * dStack_470 +
                                (double)local_5b8 * (double)local_478 +
                                (double)local_5f8._0_8_ * (double)peStack_440 +
                                (double)local_740 * (double)p_Stack_5d8);
                    local_720 = (element_type *)
                                (local_590 * dStack_470 +
                                (double)p_Stack_5b0 * (double)local_478 +
                                (double)local_5f8._8_8_ * (double)peStack_440 +
                                (double)local_740 * (double)local_5d0);
                    local_728 = (IfcProject *)
                                ((double)p_Stack_588 * dStack_470 +
                                (double)local_5a8 * (double)local_478 +
                                (double)p_Stack_5e8 * (double)peStack_440 +
                                (double)local_740 * (double)local_5c8);
                    local_438._56_8_ =
                         dStack_470 * (double)local_580 +
                         (double)local_478 * local_5a0 +
                         (double)peStack_440 * (double)p_Stack_5e0 +
                         (double)local_740 * (double)p_Stack_5c0;
                    local_438._64_8_ =
                         (double)paStack_598 * local_498 +
                         (double)local_5b8 * local_768 +
                         (double)local_5f8._0_8_ * local_468 + (double)p_Stack_5d8 * dStack_460;
                    local_438._72_8_ =
                         local_590 * local_498 +
                         (double)p_Stack_5b0 * local_768 +
                         (double)local_5f8._8_8_ * local_468 + (double)local_5d0 * dStack_460;
                    local_438._80_8_ =
                         (double)p_Stack_588 * local_498 +
                         (double)local_5a8 * local_768 +
                         (double)p_Stack_5e8 * local_468 + (double)local_5c8 * dStack_460;
                    local_438._88_8_ =
                         local_498 * (double)local_580 +
                         local_5a0 * local_768 +
                         local_468 * (double)p_Stack_5e0 + dStack_460 * (double)p_Stack_5c0;
                    local_438._96_8_ =
                         (double)paStack_598 * local_7a8 +
                         (double)local_5b8 * dStack_480 +
                         (double)local_5f8._0_8_ * dStack_490 + (double)p_Stack_5d8 * local_488;
                    local_438._104_8_ =
                         local_590 * local_7a8 +
                         (double)p_Stack_5b0 * dStack_480 +
                         (double)local_5f8._8_8_ * dStack_490 + (double)local_5d0 * local_488;
                    dStack_3c8 = (double)p_Stack_588 * local_7a8 +
                                 (double)local_5a8 * dStack_480 +
                                 (double)p_Stack_5e8 * dStack_490 + (double)local_5c8 * local_488;
                    local_3c0 = (double)local_580 * local_7a8 +
                                local_5a0 * dStack_480 +
                                (double)p_Stack_5e0 * dStack_490 + (double)p_Stack_5c0 * local_488;
                    local_438._0_8_ = local_6f8;
                    local_438._8_8_ = local_700;
                    local_438._16_8_ = local_708;
                    local_438._24_8_ = local_710;
                    local_438._32_8_ = local_718;
                    local_438._40_8_ = local_720;
                    local_438._48_8_ = local_728;
                    Assimp::IFC::TempOpening::Transform(pTVar82,(IfcMatrix4 *)local_438);
                    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                    ::push_back(&local_508,pTVar82);
                  }
                }
                local_438._0_8_ = local_628;
                local_628 = (undefined1  [8])0x0;
                std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)&local_6e8,
                           (aiNode **)local_438);
              }
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              ~vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *
                      )local_6a8);
              std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                        ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)local_628);
            }
          }
          else {
            pIVar59 = Assimp::STEP::LazyObject::
                      To<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                                (*(LazyObject **)(lVar87 + 0xd0));
            if (*(long *)(&(pIVar59->super_IfcProduct).super_IfcObject.field_0x8 +
                         *(long *)(*(long *)&(pIVar59->super_IfcProduct).super_IfcObject + -0x18))
                == *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))
            {
              puVar19 = *(undefined8 **)(lVar87 + 0xc0);
              for (puVar81 = *(undefined8 **)(lVar87 + 0xb8); puVar81 != puVar19;
                  puVar81 = puVar81 + 1) {
                paVar70 = (aiNode *)
                          Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProduct>
                                    ((LazyObject *)*puVar81);
                lVar87 = __dynamic_cast((paVar70->mName).data +
                                        *(long *)(*(long *)&paVar70->mName + -0x18) + -4,
                                        &Assimp::STEP::Object::typeinfo,
                                        &Assimp::IFC::Schema_2x3::IfcOpeningElement::typeinfo);
                if ((lVar87 == 0) &&
                   (local_438._0_8_ =
                         ProcessSpatialStructure
                                   ((anon_unknown_dwarf_d9e81e *)this_01,paVar70,el,
                                    (ConversionData *)0x0,collect_openings),
                   (tuple<aiNode_*,_std::default_delete<aiNode>_>)local_438._0_8_ !=
                   (_Head_base<0UL,_aiNode_*,_false>)0x0)) {
                  if (iStack_6e0._M_current == local_6d8) {
                    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                              ((vector<aiNode*,std::allocator<aiNode*>> *)&local_6e8,iStack_6e0,
                               (aiNode **)local_438);
                  }
                  else {
                    *iStack_6e0._M_current = (aiNode *)local_438._0_8_;
                    iStack_6e0._M_current = iStack_6e0._M_current + 1;
                  }
                }
              }
            }
          }
        }
        _Var58._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var58._M_node);
        pVar122.second._M_node = local_758._M_node;
        pVar122.first._M_node = _Var58._M_node;
      } while (_Var58._M_node != local_758._M_node);
    }
    if (_Var54._M_node != local_758._M_node) {
      puVar1 = &el[1].super_IfcObject.field_0x48;
      do {
        puVar75 = *(undefined1 **)&el[1].super_IfcObject.field_0x50;
        puVar61 = puVar1;
        if (puVar75 != (undefined1 *)0x0) {
          do {
            bVar90 = *(_Base_ptr *)(puVar75 + 0x20) < _Var54._M_node[1]._M_parent;
            if (!bVar90) {
              puVar61 = puVar75;
            }
            puVar75 = *(undefined1 **)(puVar75 + (ulong)bVar90 * 8 + 0x10);
          } while (puVar75 != (undefined1 *)0x0);
        }
        puVar75 = puVar1;
        if ((puVar61 != puVar1) &&
           (puVar75 = puVar61, _Var54._M_node[1]._M_parent < *(_Base_ptr *)(puVar61 + 0x20))) {
          puVar75 = puVar1;
        }
        if (puVar75 == puVar1) {
          pLVar62 = Assimp::STEP::DB::GetObject
                              (*(DB **)&(el->super_IfcObject).field_0x18,
                               (uint64_t)_Var54._M_node[1]._M_parent);
          pOVar63 = Assimp::STEP::LazyObject::operator*(pLVar62);
          lVar87 = __dynamic_cast(pOVar63,&Assimp::STEP::Object::typeinfo,0x7ffff0,
                                  0xffffffffffffffff);
          if ((lVar87 != 0) &&
             (pIVar64 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  (*(LazyObject **)(lVar87 + 0xa8)),
             *(long *)((pIVar64->super_IfcRoot).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
                       [-3] + (long)&(pIVar64->super_IfcRoot).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     aux_is_derived.super__Base_bitset<1UL>) ==
             *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
            _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)operator_new(0x478);
            aiNode::aiNode((aiNode *)
                           _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                           super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
            *(undefined4 *)
             _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
             super__Head_base<0UL,_aiNode_*,_false>._M_head_impl = 0xe;
            builtin_strncpy((char *)((long)_Var65.
                                           super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                           .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 4)
                            ,"$RelAggr",8);
            builtin_strncpy((char *)((long)_Var65.
                                           super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                           .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 10
                                    ),"gregates",8);
            *(char *)((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x12) = '\0';
            *(aiNode **)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x448) = this_01;
            fVar2 = (this_01->mTransformation).a2;
            uVar34 = *(undefined8 *)&(this_01->mTransformation).a3;
            uVar38 = *(undefined8 *)&(this_01->mTransformation).b1;
            uVar39 = *(undefined8 *)&(this_01->mTransformation).b3;
            uVar40 = *(undefined8 *)&(this_01->mTransformation).c1;
            uVar41 = *(undefined8 *)&(this_01->mTransformation).c3;
            uVar42 = *(undefined8 *)&(this_01->mTransformation).d1;
            uVar43 = *(undefined8 *)&(this_01->mTransformation).d3;
            ((aiMatrix4x4 *)
            ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a1 =
                 (this_01->mTransformation).a1;
            ((aiMatrix4x4 *)
            ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a2 = fVar2;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = uVar34;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) = uVar38;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = uVar39;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = uVar40;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = uVar41;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = uVar42;
            *(undefined8 *)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = uVar43;
            uVar89 = *(long *)(lVar87 + 0xb8) - *(long *)(lVar87 + 0xb0);
            if ((long)uVar89 < 0) {
              uVar89 = 0xffffffffffffffff;
            }
            local_438._0_8_ =
                 _Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                 super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                 super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
            ppaVar66 = (aiNode **)operator_new__(uVar89);
            memset(ppaVar66,0,uVar89);
            *(aiNode ***)
             ((long)_Var65.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x458) = ppaVar66;
            puVar19 = *(undefined8 **)(lVar87 + 0xb8);
            for (puVar81 = *(undefined8 **)(lVar87 + 0xb0); uVar34 = local_438._0_8_,
                puVar81 != puVar19; puVar81 = puVar81 + 1) {
              pIVar64 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar81);
              paVar70 = (aiNode *)
                        __dynamic_cast((_func_int *)
                                       ((long)&(pIVar64->super_IfcRoot).
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                               ._vptr_ObjectHelper +
                                       (long)(pIVar64->super_IfcRoot).
                                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                             ._vptr_ObjectHelper[-3]),
                                       &Assimp::STEP::Object::typeinfo,
                                       &Assimp::IFC::Schema_2x3::IfcProduct::typeinfo);
              if ((paVar70 != (aiNode *)0x0) &&
                 (paVar70 = ProcessSpatialStructure
                                      ((anon_unknown_dwarf_d9e81e *)local_438._0_8_,paVar70,el,
                                       (ConversionData *)0x0,collect_openings),
                 paVar70 != (aiNode *)0x0)) {
                uVar79 = *(uint *)(local_438._0_8_ + 0x450);
                *(uint *)(local_438._0_8_ + 0x450) = uVar79 + 1;
                (*(aiNode ***)(local_438._0_8_ + 0x458))[uVar79] = paVar70;
              }
            }
            local_438._0_8_ = (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)0x0;
            local_5f8._0_8_ = uVar34;
            std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_6e8,(aiNode **)local_5f8);
            std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                      ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)local_438);
          }
        }
        _Var54._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var54._M_node);
      } while (_Var54._M_node != local_758._M_node);
    }
    *(aiNode **)&el[1].super_IfcObject.field_0x38 = local_578;
    if (local_578 == (aiNode *)0x0) {
      *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> **)
       &el[1].super_IfcObject.field_0x30 = &local_508;
    }
    if (!bVar50) {
      if ((parent->mName).data[0xf4] == '\x01') {
        uVar79 = Assimp::IFC::ProcessMaterials
                           (*(uint64_t *)
                             ((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4)
                            ,0xffffffff,(ConversionData *)el,false);
        local_740 = (element_type *)CONCAT44(local_740._4_4_,uVar79);
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_4c8._M_impl.super__Rb_tree_header._M_header;
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((parent->mName).data[0xf4] == '\0') {
          __assert_fail("have",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/./code/Step/STEPFile.h"
                        ,0x240,
                        "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>]"
                       );
        }
        pIVar67 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProductRepresentation>
                            (*(LazyObject **)((parent->mName).data + 0xec));
        std::
        vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
        ::vector(&local_558,
                 (long)(pIVar67->Representations).
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       .
                       super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pIVar67->Representations).
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       .
                       super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_438);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>const*,Assimp::IFC::Schema_2x3::IfcRepresentation_const**>
                  ((pIVar67->Representations).
                   super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   .
                   super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pIVar67->Representations).
                   super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   .
                   super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_558.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        ppIVar48 = local_558.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        ppIVar47 = local_558.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (local_558.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_558.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar51 = (long)local_558.
                         super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_558.
                         super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar89 = lVar51 >> 3;
          lVar87 = 0x3f;
          if (uVar89 != 0) {
            for (; uVar89 >> lVar87 == 0; lVar87 = lVar87 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (local_558.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_558.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar87 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar51 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                      (ppIVar47,ppIVar48);
          }
          else {
            paVar70 = (aiNode *)(((aiString *)ppIVar47)->data + 0x7c);
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                      (ppIVar47,paVar70);
            for (; paVar70 != (aiNode *)ppIVar48; paVar70 = (aiNode *)((paVar70->mName).data + 4)) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                        (paVar70);
            }
          }
        }
        local_578 = (aiNode *)
                    local_558.
                    super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_558.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_558.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar70 = (aiNode *)
                    local_558.
                    super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            paVar68 = *(aiNode **)(*(long *)&paVar70->mName + 0x68);
            local_570 = *(aiNode **)(*(long *)&paVar70->mName + 0x70);
            local_6b0 = paVar70;
            if (paVar68 == local_570) {
              uVar79 = 0;
            }
            else {
              local_748 = (_Base_ptr)((ulong)local_748 & 0xffffffff00000000);
              do {
                pIVar69 = (IFC *)Assimp::STEP::LazyObject::
                                 To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                           (*(LazyObject **)&paVar68->mName);
                plVar53 = (long *)__dynamic_cast(pIVar69 + *(long *)(*(long *)pIVar69 + -0x18),
                                                 &Assimp::STEP::Object::typeinfo,
                                                 &Assimp::IFC::Schema_2x3::IfcMappedItem::typeinfo);
                if (plVar53 == (long *)0x0) {
                  bVar50 = Assimp::IFC::ProcessRepresentationItem
                                     (pIVar69,(IfcRepresentationItem *)
                                              ((ulong)local_740 & 0xffffffff),(uint)&local_4c8,
                                      (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)el,(ConversionData *)collect_openings);
                  uVar79 = (uint)local_748 & 0xff;
                  if (bVar50) {
                    uVar79 = 1;
                  }
                  local_748 = (_Base_ptr)CONCAT44(local_748._4_4_,uVar79);
                }
                else {
                  paVar70 = (aiNode *)operator_new(0x478);
                  aiNode::aiNode(paVar70);
                  (paVar70->mName).length = 0xd;
                  builtin_strncpy((paVar70->mName).data,"IfcMappedItem",0xe);
                  local_5f8._0_8_ = (aiNode *)0x3ff0000000000000;
                  p_Stack_5e0 = (_Rb_tree_node_base *)0x0;
                  p_Stack_5d8 = (_Rb_tree_node_base *)0x0;
                  local_5f8._8_8_ = (_Base_ptr)0x0;
                  p_Stack_5e8 = (_Base_ptr)0x0;
                  local_5d0 = (_Base_ptr)0x3ff0000000000000;
                  local_5b8 = (_Base_ptr)0x0;
                  p_Stack_5b0 = (_Base_ptr)0x0;
                  local_5c8 = (_Base_ptr)0x0;
                  p_Stack_5c0 = (_Base_ptr)0x0;
                  local_5a8 = (_Base_ptr)0x3ff0000000000000;
                  local_590 = 0.0;
                  p_Stack_588 = (_Base_ptr)0x0;
                  local_5a0 = 0.0;
                  paStack_598 = (pointer)0x0;
                  local_580 = (_Base_ptr)0x3ff0000000000000;
                  local_6f0._M_head_impl = paVar70;
                  op_00 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>
                                    ((LazyObject *)plVar53[5]);
                  Assimp::IFC::ConvertTransformOperator((IfcMatrix4 *)local_5f8,op_00);
                  local_6a8._0_8_ = (pointer)0x3ff0000000000000;
                  TStack_698.extrusionDir.x = 0.0;
                  TStack_698.extrusionDir.y = 0.0;
                  local_6a8._8_8_ = (pointer)0x0;
                  TStack_698.solid = (IfcSolidModel *)0x0;
                  TStack_698.extrusionDir.z = 1.0;
                  TStack_698.profileMesh2D.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  TStack_698.profileMesh2D.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  TStack_698.profileMesh.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  TStack_698.profileMesh.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  TStack_698.wallPoints.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                  local_640 = (_Base_ptr)0x0;
                  dStack_638 = 0.0;
                  TStack_698.wallPoints.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  TStack_698.wallPoints.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_630 = (_Base_ptr)0x3ff0000000000000;
                  pIVar71 = Assimp::STEP::LazyObject::
                            To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                      ((LazyObject *)plVar53[4]);
                  Assimp::IFC::ConvertAxisPlacement
                            ((IfcMatrix4 *)local_6a8,
                             *(IfcAxis2Placement **)
                              &(pIVar71->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                               ).field_0x10,(ConversionData *)el);
                  local_738 = local_640;
                  local_560 = TStack_698.wallPoints.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_568 = (_Rb_tree_node_base *)
                              TStack_698.profileMesh.
                              super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                  local_730 = local_630;
                  local_6f8 = (aiNode *)
                              ((double)p_Stack_5e0 * (double)local_630 +
                              (double)p_Stack_5e8 *
                              (double)TStack_698.wallPoints.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                              (double)local_5f8._0_8_ * TStack_698.extrusionDir.x +
                              (double)local_5f8._8_8_ *
                              (double)TStack_698.profileMesh.
                                      super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
                  local_728 = (IfcProject *)TStack_698.extrusionDir.y;
                  local_720 = TStack_698.profileMesh2D.
                              super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                  local_700 = (IfcProject *)
                              ((double)TStack_698.wallPoints.
                                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage *
                               (double)p_Stack_5c0 +
                              (double)TStack_698.profileMesh2D.
                                      super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr * (double)local_5c8 +
                              (double)local_6a8._0_8_ * (double)p_Stack_5d8 +
                              (double)local_5d0 * TStack_698.extrusionDir.y);
                  local_708 = (aiScene *)
                              ((double)local_640 * (double)p_Stack_5c0 +
                              (double)TStack_698.profileMesh2D.
                                      super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi * (double)local_5c8 +
                              (double)local_6a8._8_8_ * (double)p_Stack_5d8 +
                              (double)local_5d0 * TStack_698.extrusionDir.z);
                  local_710 = (element_type *)
                              (dStack_638 * (double)p_Stack_5c0 +
                              (double)TStack_698.wallPoints.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start * (double)local_5c8
                              + (double)TStack_698.solid * (double)p_Stack_5d8 +
                                (double)local_5d0 *
                                (double)TStack_698.profileMesh.
                                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
                  dVar22 = (double)p_Stack_5d8 * TStack_698.extrusionDir.x;
                  local_718 = (element_type *)
                              ((double)TStack_698.wallPoints.
                                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage *
                               local_5a0 +
                              (double)TStack_698.profileMesh2D.
                                      super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr * (double)local_5a8 +
                              (double)local_6a8._0_8_ * (double)local_5b8 +
                              (double)p_Stack_5b0 * TStack_698.extrusionDir.y);
                  dVar103 = (double)p_Stack_5b0 * TStack_698.extrusionDir.z;
                  dVar113 = (double)local_6a8._8_8_ * (double)local_5b8;
                  dVar104 = (double)p_Stack_5b0 *
                            (double)TStack_698.profileMesh.
                                    super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                  dVar119 = (double)TStack_698.solid * (double)local_5b8;
                  dVar31 = (double)p_Stack_5b0 *
                           (double)TStack_698.profileMesh.
                                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                  dVar28 = (double)local_5b8 * TStack_698.extrusionDir.x;
                  dVar32 = TStack_698.extrusionDir.y * local_590;
                  dVar118 = (double)local_6a8._0_8_ * (double)paStack_598;
                  dVar110 = (double)TStack_698.profileMesh2D.
                                    super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr * (double)p_Stack_588;
                  dVar23 = TStack_698.extrusionDir.z * local_590;
                  dVar120 = (double)local_6a8._8_8_ * (double)paStack_598;
                  dVar24 = (double)TStack_698.profileMesh2D.
                                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi * (double)p_Stack_588;
                  dVar25 = (double)TStack_698.profileMesh.
                                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr * local_590;
                  dVar107 = (double)TStack_698.solid * (double)paStack_598;
                  dVar26 = (double)TStack_698.wallPoints.
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start * (double)p_Stack_588;
                  dVar29 = local_590 *
                           (double)TStack_698.profileMesh.
                                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                  dVar27 = TStack_698.extrusionDir.x * (double)paStack_598;
                  dVar30 = (double)TStack_698.wallPoints.
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish * (double)p_Stack_588;
                  local_6a8._0_8_ =
                       (TempOpening *)
                       ((double)TStack_698.wallPoints.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage *
                        (double)p_Stack_5e0 +
                       (double)TStack_698.profileMesh2D.
                               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr * (double)p_Stack_5e8 +
                       (double)local_6a8._0_8_ * (double)local_5f8._0_8_ +
                       (double)local_5f8._8_8_ * TStack_698.extrusionDir.y);
                  local_6a8._8_8_ =
                       (TempOpening *)
                       ((double)local_640 * (double)p_Stack_5e0 +
                       (double)TStack_698.profileMesh2D.
                               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi * (double)p_Stack_5e8 +
                       (double)local_6a8._8_8_ * (double)local_5f8._0_8_ +
                       (double)local_5f8._8_8_ * TStack_698.extrusionDir.z);
                  TStack_698.solid =
                       (IfcSolidModel *)
                       (dStack_638 * (double)p_Stack_5e0 +
                       (double)TStack_698.wallPoints.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start * (double)p_Stack_5e8 +
                       (double)TStack_698.solid * (double)local_5f8._0_8_ +
                       (double)local_5f8._8_8_ *
                       (double)TStack_698.profileMesh.
                               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
                  TStack_698.extrusionDir.x = (double)local_6f8;
                  TStack_698.extrusionDir.y = (double)local_700;
                  TStack_698.extrusionDir.z = (double)local_708;
                  TStack_698.profileMesh.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       local_710;
                  TStack_698.profileMesh.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((double)p_Stack_5c0 * (double)local_630 +
                          (double)local_5c8 *
                          (double)TStack_698.wallPoints.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish +
                          dVar22 + (double)local_5d0 *
                                   (double)TStack_698.profileMesh.
                                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                  TStack_698.profileMesh2D.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       local_718;
                  TStack_698.profileMesh2D.
                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((double)local_640 * local_5a0 +
                          (double)TStack_698.profileMesh2D.
                                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi * (double)local_5a8 + dVar113 + dVar103);
                  TStack_698.wallPoints.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(dStack_638 * local_5a0 +
                                (double)TStack_698.wallPoints.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start *
                                (double)local_5a8 + dVar119 + dVar104);
                  TStack_698.wallPoints.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(local_5a0 * (double)local_630 +
                                (double)local_5a8 *
                                (double)TStack_698.wallPoints.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + dVar28 + dVar31
                                );
                  TStack_698.wallPoints.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((double)TStack_698.wallPoints.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                 (double)local_580 + dVar110 + dVar118 + dVar32);
                  local_640 = (_Base_ptr)
                              ((double)local_640 * (double)local_580 + dVar24 + dVar120 + dVar23);
                  dStack_638 = dStack_638 * (double)local_580 + dVar26 + dVar107 + dVar25;
                  local_630 = (_Base_ptr)
                              ((double)local_630 * (double)local_580 + dVar30 + dVar27 + dVar29);
                  local_620 = (undefined1  [8])((ulong)local_620 & 0xffffffff00000000);
                  local_618 = (_Base_ptr)0x0;
                  _Stack_610.super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                       (_Head_base<0UL,_aiNode_*,_false>)(_Head_base<0UL,_aiNode_*,_false>)local_620
                  ;
                  local_608 = (aiNode *)local_620;
                  local_600 = 0.0;
                  plVar76 = *(long **)&el[1].super_IfcObject.field_0x38;
                  lVar87 = 0;
                  if (plVar76 != (long *)0x0) {
                    lVar87 = (plVar76[1] - *plVar76 >> 3) * 0x2e8ba2e8ba2e8ba3;
                  }
                  if (*(long *)&el[1].super_IfcObject.field_0x30 != 0) {
                    pIVar83 = (IfcMatrix4 *)local_6a8;
                    paVar84 = (aiMatrix4x4t<double> *)local_438;
                    for (lVar51 = 0x10; lVar51 != 0; lVar51 = lVar51 + -1) {
                      paVar84->a1 = pIVar83->a1;
                      pIVar83 = (IfcMatrix4 *)((long)pIVar83 + (ulong)bVar91 * -0x10 + 8);
                      paVar84 = (aiMatrix4x4t<double> *)((long)paVar84 + (ulong)bVar91 * -0x10 + 8);
                    }
                    aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)local_438);
                    puVar81 = *(undefined8 **)&el[1].super_IfcObject.field_0x30;
                    pTVar82 = (TempOpening *)puVar81[1];
                    for (pTVar86 = (TempOpening *)*puVar81; pTVar86 != pTVar82;
                        pTVar86 = pTVar86 + 1) {
                      Assimp::IFC::TempOpening::Transform(pTVar86,(aiMatrix4x4t<double> *)local_438)
                      ;
                    }
                  }
                  uVar79 = Assimp::IFC::ProcessMaterials
                                     (*(uint64_t *)((long)plVar53 + *(long *)(*plVar53 + -0x18) + 8)
                                      ,(uint)local_740,(ConversionData *)el,false);
                  pIVar71 = Assimp::STEP::LazyObject::
                            To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                      ((LazyObject *)plVar53[4]);
                  pIVar72 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentation>
                                      (*(LazyObject **)
                                        &(pIVar71->
                                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                                         ).field_0x20);
                  pLVar88 = (pIVar72->Items).
                            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                            .
                            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pLVar20 = (pIVar72->Items).
                            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                            .
                            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (pLVar88 != pLVar20) {
                    bVar50 = false;
                    do {
                      pIVar69 = (IFC *)Assimp::STEP::LazyObject::
                                       To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                                 (pLVar88->obj);
                      bVar49 = Assimp::IFC::ProcessRepresentationItem
                                         (pIVar69,(IfcRepresentationItem *)(ulong)uVar79,
                                          (uint)local_628,
                                          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                           *)el,(ConversionData *)collect_openings);
                      bVar90 = true;
                      if (!bVar49) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_4e8,
                                   *(char **)(pIVar69 + *(long *)(*(long *)pIVar69 + -0x18) + 0x10),
                                   &local_749);
                        collect_openings =
                             (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                              *)0x1f;
                        plVar53 = (long *)std::__cxx11::string::replace
                                                    ((ulong)local_4e8,0,(char *)0x0,0x6c4453);
                        local_528 = &local_518;
                        plVar76 = plVar53 + 2;
                        if ((long *)*plVar53 == plVar76) {
                          local_518 = *plVar76;
                          lStack_510 = plVar53[3];
                        }
                        else {
                          local_518 = *plVar76;
                          local_528 = (long *)*plVar53;
                        }
                        local_520 = plVar53[1];
                        *plVar53 = (long)plVar76;
                        plVar53[1] = 0;
                        *(undefined1 *)(plVar53 + 2) = 0;
                        plVar53 = (long *)std::__cxx11::string::append((char *)&local_528);
                        psVar77 = (size_type *)(plVar53 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar53 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar77) {
                          local_6d0.field_2._M_allocated_capacity = *psVar77;
                          local_6d0.field_2._8_8_ = plVar53[3];
                          local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
                        }
                        else {
                          local_6d0.field_2._M_allocated_capacity = *psVar77;
                          local_6d0._M_dataplus._M_p = (pointer)*plVar53;
                        }
                        local_6d0._M_string_length = plVar53[1];
                        *plVar53 = (long)psVar77;
                        plVar53[1] = 0;
                        *(undefined1 *)(plVar53 + 2) = 0;
                        Assimp::Formatter::
                        basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                        basic_formatter<std::__cxx11::string>
                                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)local_438,&local_6d0);
                        Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_438);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                        std::ios_base::~ios_base((ios_base *)&dStack_3c8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
                          operator_delete(local_6d0._M_dataplus._M_p,
                                          local_6d0.field_2._M_allocated_capacity + 1);
                        }
                        if (local_528 != &local_518) {
                          operator_delete(local_528,local_518 + 1);
                        }
                        bVar90 = bVar50;
                        if (local_4e8[0] != local_4d8) {
                          operator_delete(local_4e8[0],local_4d8[0] + 1);
                        }
                      }
                      pLVar88 = pLVar88 + 1;
                      bVar50 = bVar90;
                    } while (pLVar88 != pLVar20);
                    if (bVar90) {
                      Assimp::IFC::AssignAddedMeshes
                                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)local_628,local_6f0._M_head_impl,(ConversionData *)el);
                      plVar53 = *(long **)&el[1].super_IfcObject.field_0x38;
                      if ((plVar53 != (long *)0x0) &&
                         (lVar51 = (plVar53[1] - *plVar53 >> 3) * 0x2e8ba2e8ba2e8ba3 - lVar87,
                         lVar51 != 0)) {
                        lVar87 = lVar87 * 0x58;
                        do {
                          Assimp::IFC::TempOpening::Transform
                                    ((TempOpening *)
                                     (**(long **)&el[1].super_IfcObject.field_0x38 + lVar87),
                                     (IfcMatrix4 *)local_6a8);
                          lVar87 = lVar87 + 0x58;
                          lVar51 = lVar51 + -1;
                        } while (lVar51 != 0);
                      }
                      local_438._0_8_ = local_6f0._M_head_impl;
                      fVar117 = (float)(double)local_6a8._0_8_;
                      fVar108 = (float)(double)local_6a8._8_8_;
                      fVar96 = (float)TStack_698.extrusionDir.y;
                      fVar112 = (float)TStack_698.extrusionDir.z;
                      fVar105 = (float)(double)TStack_698.profileMesh.
                                               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr;
                      fVar116 = (float)(double)TStack_698.profileMesh2D.
                                               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr;
                      fVar111 = (float)(double)TStack_698.profileMesh2D.
                                               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi;
                      fVar114 = (float)(double)TStack_698.wallPoints.
                                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      fVar109 = (float)(double)local_640;
                      fVar2 = (this_01->mTransformation).a1;
                      fVar3 = (this_01->mTransformation).a2;
                      fVar4 = (this_01->mTransformation).a3;
                      fVar5 = (this_01->mTransformation).a4;
                      fVar97 = fVar109 * fVar5 + fVar111 * fVar4 + fVar108 * fVar2 + fVar3 * fVar112
                      ;
                      local_6f8 = (aiNode *)CONCAT44(local_6f8._4_4_,fVar97);
                      fVar121 = (float)(double)TStack_698.solid;
                      fVar106 = (float)(double)TStack_698.wallPoints.
                                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                      fVar98 = (float)dStack_638;
                      fVar115 = (float)TStack_698.extrusionDir.x;
                      fVar99 = fVar98 * fVar5 + fVar106 * fVar4 + fVar121 * fVar2 + fVar3 * fVar105;
                      local_700 = (IfcProject *)CONCAT44(local_700._4_4_,fVar99);
                      fVar93 = (float)(double)TStack_698.profileMesh.
                                              super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi;
                      fVar94 = (float)(double)TStack_698.wallPoints.
                                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                      local_738 = (_Base_ptr)CONCAT44(local_738._4_4_,fVar115);
                      fVar92 = (float)(double)local_630;
                      fVar102 = fVar5 * fVar92 + fVar4 * fVar94 + fVar2 * fVar115 + fVar3 * fVar93;
                      local_708 = (aiScene *)CONCAT44(local_708._4_4_,fVar102);
                      fVar6 = (this_01->mTransformation).b2;
                      local_730 = (_Base_ptr)CONCAT44(local_730._4_4_,fVar96);
                      fVar7 = (this_01->mTransformation).b1;
                      fVar8 = (this_01->mTransformation).b3;
                      local_728 = (IfcProject *)CONCAT44(local_728._4_4_,fVar116);
                      fVar9 = (this_01->mTransformation).b4;
                      fVar95 = fVar114 * fVar9 + fVar116 * fVar8 + fVar117 * fVar7 + fVar6 * fVar96;
                      local_710 = (element_type *)CONCAT44(local_710._4_4_,fVar95);
                      fVar100 = fVar109 * fVar9 +
                                fVar111 * fVar8 + fVar108 * fVar7 + fVar6 * fVar112;
                      local_718 = (element_type *)CONCAT44(local_718._4_4_,fVar100);
                      fVar101 = fVar98 * fVar9 + fVar106 * fVar8 + fVar121 * fVar7 + fVar6 * fVar105
                      ;
                      local_720 = (element_type *)CONCAT44(local_720._4_4_,fVar101);
                      fVar10 = (this_01->mTransformation).c2;
                      fVar11 = (this_01->mTransformation).c1;
                      fVar12 = (this_01->mTransformation).c3;
                      fVar13 = (this_01->mTransformation).c4;
                      fVar14 = (this_01->mTransformation).d2;
                      fVar15 = (this_01->mTransformation).d1;
                      fVar16 = (this_01->mTransformation).d3;
                      fVar17 = (this_01->mTransformation).d4;
                      ((local_6f0._M_head_impl)->mTransformation).a1 =
                           fVar114 * fVar5 + fVar116 * fVar4 + fVar117 * fVar2 + fVar3 * fVar96;
                      ((local_6f0._M_head_impl)->mTransformation).a2 = fVar97;
                      ((local_6f0._M_head_impl)->mTransformation).a3 = fVar99;
                      ((local_6f0._M_head_impl)->mTransformation).a4 = fVar102;
                      ((local_6f0._M_head_impl)->mTransformation).b1 = fVar95;
                      ((local_6f0._M_head_impl)->mTransformation).b2 = fVar100;
                      ((local_6f0._M_head_impl)->mTransformation).b3 = fVar101;
                      ((local_6f0._M_head_impl)->mTransformation).b4 =
                           fVar9 * fVar92 + fVar8 * fVar94 + fVar7 * fVar115 + fVar6 * fVar93;
                      ((local_6f0._M_head_impl)->mTransformation).c1 =
                           fVar114 * fVar13 + fVar116 * fVar12 + fVar117 * fVar11 + fVar10 * fVar96;
                      ((local_6f0._M_head_impl)->mTransformation).c2 =
                           fVar109 * fVar13 + fVar111 * fVar12 + fVar108 * fVar11 + fVar10 * fVar112
                      ;
                      ((local_6f0._M_head_impl)->mTransformation).c3 =
                           fVar98 * fVar13 + fVar106 * fVar12 + fVar121 * fVar11 + fVar10 * fVar105;
                      ((local_6f0._M_head_impl)->mTransformation).c4 =
                           fVar13 * fVar92 + fVar12 * fVar94 + fVar11 * fVar115 + fVar10 * fVar93;
                      ((local_6f0._M_head_impl)->mTransformation).d1 =
                           fVar114 * fVar17 + fVar116 * fVar16 + fVar117 * fVar15 + fVar96 * fVar14;
                      ((local_6f0._M_head_impl)->mTransformation).d2 =
                           fVar109 * fVar17 + fVar111 * fVar16 + fVar108 * fVar15 + fVar112 * fVar14
                      ;
                      ((local_6f0._M_head_impl)->mTransformation).d3 =
                           fVar98 * fVar17 + fVar106 * fVar16 + fVar121 * fVar15 + fVar105 * fVar14;
                      ((local_6f0._M_head_impl)->mTransformation).d4 =
                           fVar92 * fVar17 + fVar94 * fVar16 + fVar115 * fVar15 + fVar14 * fVar93;
                      local_6f0._M_head_impl = (aiNode *)0x0;
                      ppaVar73 = std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                                           ((vector<aiNode*,std::allocator<aiNode*>> *)&local_6e8,
                                            (aiNode **)local_438);
                      local_748 = (_Base_ptr)
                                  CONCAT44(local_748._4_4_,
                                           (int)CONCAT71((int7)((ulong)ppaVar73 >> 8),1));
                    }
                  }
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_628);
                  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_6f0);
                }
                paVar68 = (aiNode *)((paVar68->mName).data + 4);
              } while (paVar68 != local_570);
              uVar79 = (uint)local_748;
            }
          } while (((uVar79 & 1) == 0) &&
                  (paVar70 = (aiNode *)((local_6b0->mName).data + 4), paVar70 != local_578));
        }
        Assimp::IFC::AssignAddedMeshes
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &local_4c8,this_01,(ConversionData *)el);
        if ((aiNode *)
            local_558.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (aiNode *)0x0) {
          operator_delete(local_558.
                          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_558.
                                super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_558.
                                super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_4c8);
      }
      *(undefined8 *)&el[1].super_IfcObject.field_0x30 = 0;
      *(undefined8 *)&el[1].super_IfcObject.field_0x38 = 0;
    }
    iVar45._M_current = iStack_6e0._M_current;
    ppaVar66 = local_6e8;
    uVar89 = (long)iStack_6e0._M_current - (long)local_6e8;
    if (uVar89 != 0) {
      __n_01 = 0xffffffffffffffff;
      if (-1 < (long)uVar89) {
        __n_01 = uVar89;
      }
      __s_00 = (aiNode **)operator_new__(__n_01);
      memset(__s_00,0,__n_01);
      this_01->mChildren = __s_00;
      for (; ppaVar66 != iVar45._M_current; ppaVar66 = ppaVar66 + 1) {
        paVar70 = *ppaVar66;
        uVar79 = this_01->mNumChildren;
        this_01->mNumChildren = uVar79 + 1;
        this_01->mChildren[uVar79] = paVar70;
        paVar70->mParent = this_01;
      }
    }
    uVar89 = *(ulong *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    __position._M_node = (_Base_ptr)&el[1].super_IfcObject.field_0x48;
    p_Var21 = *(_Base_ptr *)&el[1].super_IfcObject.field_0x50;
    p_Var78 = __position._M_node;
    for (p_Var18 = p_Var21; p_Var18 != (_Base_ptr)0x0;
        p_Var18 = (&p_Var18->_M_left)[*(ulong *)(p_Var18 + 1) < uVar89]) {
      if (*(ulong *)(p_Var18 + 1) >= uVar89) {
        p_Var78 = p_Var18;
      }
    }
    p_Var85 = __position._M_node;
    if ((p_Var78 != __position._M_node) && (p_Var85 = p_Var78, uVar89 < *(ulong *)(p_Var78 + 1))) {
      p_Var85 = __position._M_node;
    }
    p_Var78 = __position._M_node;
    if (p_Var85 == __position._M_node) {
      __assert_fail("conv.already_processed.find(el.GetID()) != conv.already_processed.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x365,
                    "aiNode *(anonymous namespace)::ProcessSpatialStructure(aiNode *, const Schema_2x3::IfcProduct &, ConversionData &, std::vector<TempOpening> *)"
                   );
    }
    for (; p_Var21 != (_Base_ptr)0x0;
        p_Var21 = (&p_Var21->_M_left)[*(ulong *)(p_Var21 + 1) < uVar89]) {
      if (*(ulong *)(p_Var21 + 1) >= uVar89) {
        p_Var78 = p_Var21;
      }
    }
    if ((p_Var78 != __position._M_node) && (*(ulong *)(p_Var78 + 1) <= uVar89)) {
      __position._M_node = p_Var78;
    }
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)local_530,__position);
    if (local_6e8 != (aiNode **)0x0) {
      operator_delete(local_6e8,(long)local_6d8 - (long)local_6e8);
    }
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              (&local_508);
  }
  return this_01;
}

Assistant:

aiNode* ProcessSpatialStructure(aiNode* parent, const Schema_2x3::IfcProduct& el, ConversionData& conv,
        std::vector<TempOpening>* collect_openings = nullptr ) {
    const STEP::DB::RefMap& refs = conv.db.GetRefs();

    // skip over space and annotation nodes - usually, these have no meaning in Assimp's context
    bool skipGeometry = false;
    if(conv.settings.skipSpaceRepresentations) {
        if(el.ToPtr<Schema_2x3::IfcSpace>()) {
            IFCImporter::LogDebug("skipping IfcSpace entity due to importer settings");
            skipGeometry = true;
        }
    }

    if(conv.settings.skipAnnotations) {
        if(el.ToPtr<Schema_2x3::IfcAnnotation>()) {
            IFCImporter::LogDebug("skipping IfcAnnotation entity due to importer settings");
            return nullptr;
        }
    }

    // add an output node for this spatial structure
    aiNode *nd(new aiNode );
    nd->mName.Set(el.GetClassName()+"_"+(el.Name?el.Name.Get():"Unnamed")+"_"+el.GlobalId);
    nd->mParent = parent;

    conv.already_processed.insert(el.GetID());

    // check for node metadata
    STEP::DB::RefMapRange children = refs.equal_range(el.GetID());
    if (children.first!=refs.end()) {
        Metadata properties;
        if (children.first==children.second) {
            // handles single property set
            ProcessMetadata((*children.first).second, conv, properties);
        } else {
            // handles multiple property sets (currently all property sets are merged,
            // which may not be the best solution in the long run)
            for (STEP::DB::RefMap::const_iterator it=children.first; it!=children.second; ++it) {
                ProcessMetadata((*it).second, conv, properties);
            }
        }

        if (!properties.empty()) {
            aiMetadata* data = aiMetadata::Alloc( static_cast<unsigned int>(properties.size()) );
            unsigned int index( 0 );
            for ( const Metadata::value_type& kv : properties ) {
                data->Set( index++, kv.first, aiString( kv.second ) );
            }
            nd->mMetaData = data;
        }
    }

    if(el.ObjectPlacement) {
        ResolveObjectPlacement(nd->mTransformation,el.ObjectPlacement.Get(),conv);
    }

    std::vector<TempOpening> openings;

    IfcMatrix4 myInv;
    bool didinv = false;

    // convert everything contained directly within this structure,
    // this may result in more nodes.
    std::vector< aiNode* > subnodes;
    try {
        // locate aggregates and 'contained-in-here'-elements of this spatial structure and add them in recursively
        // on our way, collect openings in *this* element
        STEP::DB::RefMapRange range = refs.equal_range(el.GetID());

        for(STEP::DB::RefMapRange range2 = range; range2.first != range.second; ++range2.first) {
            // skip over meshes that have already been processed before. This is strictly necessary
            // because the reverse indices also include references contained in argument lists and
            // therefore every element has a back-reference hold by its parent.
            if (conv.already_processed.find((*range2.first).second) != conv.already_processed.end()) {
                continue;
            }
            const STEP::LazyObject& obj = conv.db.MustGetObject((*range2.first).second);

            // handle regularly-contained elements
            if(const Schema_2x3::IfcRelContainedInSpatialStructure* const cont = obj->ToPtr<Schema_2x3::IfcRelContainedInSpatialStructure>()) {
                if(cont->RelatingStructure->GetID() != el.GetID()) {
                    continue;
                }
                for(const Schema_2x3::IfcProduct& pro : cont->RelatedElements) {
                    if(pro.ToPtr<Schema_2x3::IfcOpeningElement>()) {
                        // IfcOpeningElement is handled below. Sadly we can't use it here as is:
                        // The docs say that opening elements are USUALLY attached to building storey,
                        // but we want them for the building elements to which they belong.
                        continue;
                    }

                    aiNode* const ndnew = ProcessSpatialStructure(nd,pro,conv,nullptr);
                    if(ndnew) {
                        subnodes.push_back( ndnew );
                    }
                }
            }
            // handle openings, which we collect in a list rather than adding them to the node graph
            else if(const Schema_2x3::IfcRelVoidsElement* const fills = obj->ToPtr<Schema_2x3::IfcRelVoidsElement>()) {
                if(fills->RelatingBuildingElement->GetID() == el.GetID()) {
                    const Schema_2x3::IfcFeatureElementSubtraction& open = fills->RelatedOpeningElement;

                    // move opening elements to a separate node since they are semantically different than elements that are just 'contained'
                    std::unique_ptr<aiNode> nd_aggr(new aiNode());
                    nd_aggr->mName.Set("$RelVoidsElement");
                    nd_aggr->mParent = nd;

                    nd_aggr->mTransformation = nd->mTransformation;

                    std::vector<TempOpening> openings_local;
                    aiNode* const ndnew = ProcessSpatialStructure( nd_aggr.get(),open, conv,&openings_local);
                    if (ndnew) {

                        nd_aggr->mNumChildren = 1;
                        nd_aggr->mChildren = new aiNode*[1]();


                        nd_aggr->mChildren[0] = ndnew;

                        if(openings_local.size()) {
                            if (!didinv) {
                                myInv = aiMatrix4x4(nd->mTransformation ).Inverse();
                                didinv = true;
                            }

                            // we need all openings to be in the local space of *this* node, so transform them
                            for(TempOpening& op :openings_local) {
                                op.Transform( myInv*nd_aggr->mChildren[0]->mTransformation);
                                openings.push_back(op);
                            }
                        }
                        subnodes.push_back( nd_aggr.release() );
                    }
                }
            }
        }

        for(;range.first != range.second; ++range.first) {
            // see note in loop above
            if (conv.already_processed.find((*range.first).second) != conv.already_processed.end()) {
                continue;
            }
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {
                if(aggr->RelatingObject->GetID() != el.GetID()) {
                    continue;
                }

                // move aggregate elements to a separate node since they are semantically different than elements that are just 'contained'
                std::unique_ptr<aiNode> nd_aggr(new aiNode());
                nd_aggr->mName.Set("$RelAggregates");
                nd_aggr->mParent = nd;

                nd_aggr->mTransformation = nd->mTransformation;

                nd_aggr->mChildren = new aiNode*[aggr->RelatedObjects.size()]();
                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    if(const Schema_2x3::IfcProduct* const prod = def.ToPtr<Schema_2x3::IfcProduct>()) {

                        aiNode* const ndnew = ProcessSpatialStructure(nd_aggr.get(),*prod,conv,NULL);
                        if(ndnew) {
                            nd_aggr->mChildren[nd_aggr->mNumChildren++] = ndnew;
                        }
                    }
                }

                subnodes.push_back( nd_aggr.release() );
            }
        }

        conv.collect_openings = collect_openings;
        if(!conv.collect_openings) {
            conv.apply_openings = &openings;
        }

        if (!skipGeometry) {
          ProcessProductRepresentation(el, nd, subnodes, conv);
          conv.apply_openings = conv.collect_openings = nullptr;
        }

        if (subnodes.size()) {
            nd->mChildren = new aiNode*[subnodes.size()]();
            for(aiNode* nd2 : subnodes) {
                nd->mChildren[nd->mNumChildren++] = nd2;
                nd2->mParent = nd;
            }
        }
    } catch(...) {
        // it hurts, but I don't want to pull boost::ptr_vector into -noboost only for these few spots here
        std::for_each(subnodes.begin(),subnodes.end(),delete_fun<aiNode>());
        throw;
    }

    ai_assert(conv.already_processed.find(el.GetID()) != conv.already_processed.end());
    conv.already_processed.erase(conv.already_processed.find(el.GetID()));
    return nd;
}